

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

DisasJumpType op_sck(DisasContext_conflict13 *s,DisasOps *o)

{
  TCGContext_conflict12 *tcg_ctx_00;
  TCGv_i64 val;
  TCGv_i64 addr;
  int iVar1;
  TCGContext_conflict12 *tcg_ctx;
  DisasOps *o_local;
  DisasContext_conflict13 *s_local;
  
  tcg_ctx_00 = s->uc->tcg_ctx;
  val = o->in1;
  addr = o->addr1;
  iVar1 = get_mem_index(s);
  tcg_gen_qemu_ld_i64_s390x(tcg_ctx_00,val,addr,(long)iVar1,MO_ALIGN|MO_BEQ);
  gen_helper_sck(tcg_ctx_00,tcg_ctx_00->cc_op,tcg_ctx_00->cpu_env,o->in1);
  set_cc_static(s);
  return DISAS_NEXT;
}

Assistant:

static DisasJumpType op_sck(DisasContext *s, DisasOps *o)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    tcg_gen_qemu_ld_i64(tcg_ctx, o->in1, o->addr1, get_mem_index(s), MO_TEQ | MO_ALIGN);
    gen_helper_sck(tcg_ctx, tcg_ctx->cc_op, tcg_ctx->cpu_env, o->in1);
    set_cc_static(s);
    return DISAS_NEXT;
}